

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

int BZ2_bzCompressInit(bz_stream *strm,int blockSize100k,int verbosity,int workFactor)

{
  int iVar1;
  EState *s_00;
  UInt32 *pUVar2;
  EState *s;
  Int32 n;
  int workFactor_local;
  int verbosity_local;
  int blockSize100k_local;
  bz_stream *strm_local;
  
  iVar1 = bz_config_ok();
  if (iVar1 == 0) {
    strm_local._4_4_ = -9;
  }
  else if ((((strm == (bz_stream *)0x0) || (blockSize100k < 1)) || (9 < blockSize100k)) ||
          ((workFactor < 0 || (0xfa < workFactor)))) {
    strm_local._4_4_ = -2;
  }
  else {
    s._4_4_ = workFactor;
    if (workFactor == 0) {
      s._4_4_ = 0x1e;
    }
    if (strm->bzalloc == (_func_void_ptr_void_ptr_int_int *)0x0) {
      strm->bzalloc = default_bzalloc;
    }
    if (strm->bzfree == (_func_void_void_ptr_void_ptr *)0x0) {
      strm->bzfree = default_bzfree;
    }
    s_00 = (EState *)(*strm->bzalloc)(strm->opaque,0xd9d8,1);
    if (s_00 == (EState *)0x0) {
      strm_local._4_4_ = -3;
    }
    else {
      s_00->strm = strm;
      s_00->arr1 = (UInt32 *)0x0;
      s_00->arr2 = (UInt32 *)0x0;
      s_00->ftab = (UInt32 *)0x0;
      pUVar2 = (UInt32 *)(*strm->bzalloc)(strm->opaque,blockSize100k * 400000,1);
      s_00->arr1 = pUVar2;
      pUVar2 = (UInt32 *)(*strm->bzalloc)(strm->opaque,(blockSize100k * 100000 + 0x22) * 4,1);
      s_00->arr2 = pUVar2;
      pUVar2 = (UInt32 *)(*strm->bzalloc)(strm->opaque,0x40004,1);
      s_00->ftab = pUVar2;
      if (((s_00->arr1 == (UInt32 *)0x0) || (s_00->arr2 == (UInt32 *)0x0)) ||
         (s_00->ftab == (UInt32 *)0x0)) {
        if (s_00->arr1 != (UInt32 *)0x0) {
          (*strm->bzfree)(strm->opaque,s_00->arr1);
        }
        if (s_00->arr2 != (UInt32 *)0x0) {
          (*strm->bzfree)(strm->opaque,s_00->arr2);
        }
        if (s_00->ftab != (UInt32 *)0x0) {
          (*strm->bzfree)(strm->opaque,s_00->ftab);
        }
        if (s_00 != (EState *)0x0) {
          (*strm->bzfree)(strm->opaque,s_00);
        }
        strm_local._4_4_ = -3;
      }
      else {
        s_00->blockNo = 0;
        s_00->state = 2;
        s_00->mode = 2;
        s_00->combinedCRC = 0;
        s_00->blockSize100k = blockSize100k;
        s_00->nblockMAX = blockSize100k * 100000 + -0x13;
        s_00->verbosity = verbosity;
        s_00->workFactor = s._4_4_;
        s_00->block = (UChar *)s_00->arr2;
        s_00->mtfv = (UInt16 *)s_00->arr1;
        s_00->zbits = (UChar *)0x0;
        s_00->ptr = s_00->arr1;
        strm->state = s_00;
        strm->total_in_lo32 = 0;
        strm->total_in_hi32 = 0;
        strm->total_out_lo32 = 0;
        strm->total_out_hi32 = 0;
        init_RL(s_00);
        prepare_new_block(s_00);
        strm_local._4_4_ = 0;
      }
    }
  }
  return strm_local._4_4_;
}

Assistant:

int BZ_API(BZ2_bzCompressInit) 
                    ( bz_stream* strm, 
                     int        blockSize100k,
                     int        verbosity,
                     int        workFactor )
{
   Int32   n;
   EState* s;

   if (!bz_config_ok()) return BZ_CONFIG_ERROR;

   if (strm == NULL || 
       blockSize100k < 1 || blockSize100k > 9 ||
       workFactor < 0 || workFactor > 250)
     return BZ_PARAM_ERROR;

   if (workFactor == 0) workFactor = 30;
   if (strm->bzalloc == NULL) strm->bzalloc = default_bzalloc;
   if (strm->bzfree == NULL) strm->bzfree = default_bzfree;

   s = BZALLOC( sizeof(EState) );
   if (s == NULL) return BZ_MEM_ERROR;
   s->strm = strm;

   s->arr1 = NULL;
   s->arr2 = NULL;
   s->ftab = NULL;

   n       = 100000 * blockSize100k;
   s->arr1 = BZALLOC( n                  * sizeof(UInt32) );
   s->arr2 = BZALLOC( (n+BZ_N_OVERSHOOT) * sizeof(UInt32) );
   s->ftab = BZALLOC( 65537              * sizeof(UInt32) );

   if (s->arr1 == NULL || s->arr2 == NULL || s->ftab == NULL) {
      if (s->arr1 != NULL) BZFREE(s->arr1);
      if (s->arr2 != NULL) BZFREE(s->arr2);
      if (s->ftab != NULL) BZFREE(s->ftab);
      if (s       != NULL) BZFREE(s);
      return BZ_MEM_ERROR;
   }

   s->blockNo           = 0;
   s->state             = BZ_S_INPUT;
   s->mode              = BZ_M_RUNNING;
   s->combinedCRC       = 0;
   s->blockSize100k     = blockSize100k;
   s->nblockMAX         = 100000 * blockSize100k - 19;
   s->verbosity         = verbosity;
   s->workFactor        = workFactor;

   s->block             = (UChar*)s->arr2;
   s->mtfv              = (UInt16*)s->arr1;
   s->zbits             = NULL;
   s->ptr               = (UInt32*)s->arr1;

   strm->state          = s;
   strm->total_in_lo32  = 0;
   strm->total_in_hi32  = 0;
   strm->total_out_lo32 = 0;
   strm->total_out_hi32 = 0;
   init_RL ( s );
   prepare_new_block ( s );
   return BZ_OK;
}